

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper::
logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper
          (logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper *this,TestDetails *details)

{
  logonAtLogonStartTimeFixture::logonAtLogonStartTimeFixture
            (&this->super_logonAtLogonStartTimeFixture);
  (this->super_logonAtLogonStartTimeFixture).super_acceptorFixture.super_sessionFixture.
  super_TestCallback.super_Responder._vptr_Responder = (_func_int **)&PTR__sessionFixture_00326298;
  (this->super_logonAtLogonStartTimeFixture).super_acceptorFixture.super_sessionFixture.
  super_TestCallback.super_NullApplication.super_Application._vptr_Application =
       (_func_int **)&PTR__logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper_003262f0;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(logonAtLogonStartTimeFixture, logonAtLogonStartTime)
{
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  object->next( createHeartbeat( "ISLD", "TW", 2 ), UtcTimeStamp() );

  CHECK_EQUAL( 0, toLogon );
  CHECK_EQUAL( 0, toLogout );
  process_sleep( 1 );

  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  object->next( createHeartbeat( "ISLD", "TW", 2 ), UtcTimeStamp() );
  object->next();
  CHECK_EQUAL( 1, toLogon );
  CHECK_EQUAL( 0, toLogout );

  process_sleep( 2 );
  object->next();
  CHECK_EQUAL( 1, toLogon );
  CHECK_EQUAL( 1, toLogout );
}